

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O1

void Gia_ManPrintStateEncoding(Vec_Vec_t *vCodes,int nBits)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  char *__s;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  __s = (char *)malloc((long)(nBits + 1));
  __s[nBits] = '\0';
  if (0 < vCodes->nSize) {
    uVar6 = 0;
    do {
      pvVar2 = vCodes->pArray[uVar6];
      uVar6 = uVar6 + 1;
      printf("%6d : ",uVar6 & 0xffffffff);
      memset(__s,0x2d,(long)nBits);
      lVar4 = (long)*(int *)((long)pvVar2 + 4);
      if (0 < lVar4) {
        lVar3 = *(long *)((long)pvVar2 + 8);
        lVar5 = 0;
        do {
          iVar1 = *(int *)(lVar3 + lVar5 * 4);
          if (nBits <= iVar1) {
            __assert_fail("Bit < nBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                          ,0x3b,"void Gia_ManPrintStateEncoding(Vec_Vec_t *, int)");
          }
          __s[iVar1] = '1';
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      puts(__s);
    } while ((long)uVar6 < (long)vCodes->nSize);
  }
  if (__s != (char *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManPrintStateEncoding( Vec_Vec_t * vCodes, int nBits )
{
    char * pBuffer;
    Vec_Int_t * vVec;
    int i, k, Bit;
    pBuffer = ABC_ALLOC( char, nBits + 1 );
    pBuffer[nBits] = 0;
    Vec_VecForEachLevelInt( vCodes, vVec, i )
    {
        printf( "%6d : ", i+1 );
        memset( pBuffer, '-', nBits );
        Vec_IntForEachEntry( vVec, Bit, k )
        {
            assert( Bit < nBits );
            pBuffer[Bit] = '1';
        }
        printf( "%s\n", pBuffer );
    }
    ABC_FREE( pBuffer );
}